

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtimezoneprivate_tz.cpp
# Opt level: O1

int parsePosixTime(char *begin,char *end)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  char *pcVar4;
  QSimpleParsedNumber<long_long> QVar5;
  QSimpleParsedNumber<long_long> QVar6;
  
  QVar5 = qstrntoll(begin,(long)end - (long)begin,10);
  iVar1 = -0x80000000;
  if (0xfffffffffffffffd < QVar5.used - 3U && 0xfffffeec < (int)QVar5.result - 0x8aU) {
    pcVar4 = begin + QVar5.used;
    uVar2 = 0;
    if ((pcVar4 < end) && (*pcVar4 == ':')) {
      pcVar4 = pcVar4 + 1;
      QVar6 = qstrntoll(pcVar4,(long)end - (long)pcVar4,10);
      uVar3 = (uint)QVar6.result;
      if (QVar6.used - 3U < 0xfffffffffffffffe || 0x3b < uVar3) {
        return -0x80000000;
      }
      pcVar4 = pcVar4 + QVar6.used;
      if ((pcVar4 < end) && (*pcVar4 == ':')) {
        pcVar4 = pcVar4 + 1;
        QVar6 = qstrntoll(pcVar4,(long)end - (long)pcVar4,10);
        uVar2 = (uint)QVar6.result;
        if (QVar6.used - 3U < 0xfffffffffffffffe || 0x3b < uVar2) {
          return -0x80000000;
        }
        pcVar4 = pcVar4 + QVar6.used;
      }
    }
    else {
      uVar3 = 0;
    }
    if (pcVar4 == end) {
      iVar1 = (uVar3 + (int)QVar5.result * 0x3c) * 0x3c + uVar2;
    }
  }
  return iVar1;
}

Assistant:

static int parsePosixTime(const char *begin, const char *end)
{
    // Format "hh[:mm[:ss]]"
    int hour, min = 0, sec = 0;

    const int maxHour = 137; // POSIX's extended range.
    auto r = qstrntoll(begin, end - begin, 10);
    hour = r.result;
    if (!r.ok() || hour < -maxHour || hour > maxHour || r.used > 2)
        return INT_MIN;
    begin += r.used;
    if (begin < end && *begin == ':') {
        // minutes
        ++begin;
        r = qstrntoll(begin, end - begin, 10);
        min = r.result;
        if (!r.ok() || min < 0 || min > 59 || r.used > 2)
            return INT_MIN;

        begin += r.used;
        if (begin < end && *begin == ':') {
            // seconds
            ++begin;
            r = qstrntoll(begin, end - begin, 10);
            sec = r.result;
            if (!r.ok() || sec < 0 || sec > 59 || r.used > 2)
                return INT_MIN;
            begin += r.used;
        }
    }

    // we must have consumed everything
    if (begin != end)
        return INT_MIN;

    return (hour * 60 + min) * 60 + sec;
}